

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O2

int slu_mmdint_(int *neqns,int_t *xadj,shortint *adjncy,shortint *dhead,int *dforw,int *dbakw,
               shortint *qsize,shortint *llist,shortint *marker)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)*neqns;
  if (*neqns < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    dhead[uVar4] = 0;
    qsize[uVar4] = 1;
    marker[uVar4] = 0;
    llist[uVar4] = 0;
  }
  uVar2 = 0;
  if (0 < *neqns) {
    uVar2 = (ulong)(uint)*neqns;
  }
  for (lVar3 = 1; lVar3 - uVar2 != 1; lVar3 = lVar3 + 1) {
    lVar5 = (long)xadj[lVar3] - (long)xadj[lVar3 + -1];
    iVar1 = dhead[lVar5];
    dforw[lVar3 + -1] = iVar1;
    dhead[lVar5] = (shortint)lVar3;
    if (0 < (long)iVar1) {
      dbakw[(long)iVar1 + -1] = (shortint)lVar3;
    }
    dbakw[lVar3 + -1] = ~(uint)lVar5;
  }
  return 0;
}

Assistant:

int slu_mmdint_(const int *neqns, int_t *xadj, shortint *adjncy,
	shortint *dhead, int *dforw, int *dbakw, shortint *qsize, 
	shortint *llist, shortint *marker)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    int ndeg, node, fnode;

/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dbakw;
    --dforw;
    --dhead;
    --adjncy;
    --xadj;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	dhead[node] = 0;
	qsize[node] = 1;
	marker[node] = 0;
	llist[node] = 0;
/* L100: */
    }
/*        ------------------------------------------ */
/*        INITIALIZE THE DEGREE DOUBLY LINKED LISTS. */
/*        ------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	ndeg = xadj[node + 1] - xadj[node] + 1;
	fnode = dhead[ndeg];
	dforw[node] = fnode;
	dhead[ndeg] = node;
	if (fnode > 0) {
	    dbakw[fnode] = node;
	}
	dbakw[node] = -ndeg;
/* L200: */
    }
    return 0;

}